

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTFlightData.cpp
# Opt level: O3

string * __thiscall
LTFlightData::ComposeLabel_abi_cxx11_(string *__return_storage_ptr__,LTFlightData *this)

{
  pointer pcVar1;
  LTAircraft *pLVar2;
  LabelCfgTy LVar3;
  uint uVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  char *__s;
  ulong uVar10;
  flightPhaseE phase;
  string *psVar11;
  uint uVar12;
  pthread_mutex_t *__mutex;
  string __str;
  string local_90;
  _Alloc_hider local_70;
  ulong local_68;
  size_type local_60;
  undefined8 uStack_58;
  allocator<char> local_49;
  LTFlightData *local_48;
  pthread_mutex_t *local_40;
  string *local_38;
  
  local_40 = (pthread_mutex_t *)&this->dataAccessMutex;
  iVar6 = pthread_mutex_lock(local_40);
  LVar3 = dataRefs.labelCfg;
  local_48 = this;
  local_38 = __return_storage_ptr__;
  if (iVar6 != 0) {
    std::__throw_system_error(iVar6);
  }
  local_70._M_p = (pointer)&local_60;
  pcVar1 = (this->labelStat)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + (this->labelStat)._M_string_length);
  psVar11 = local_38;
  pLVar2 = this->pAc;
  if (pLVar2 != (LTAircraft *)0x0) {
    if ((dataRefs.bLabelForParked == 0) && (pLVar2->phase == FPH_PARKED)) {
      (local_38->_M_dataplus)._M_p = (pointer)&local_38->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"");
      __mutex = local_40;
      if ((size_type *)local_70._M_p != &local_60) {
        operator_delete(local_70._M_p,local_60 + 1);
      }
      goto LAB_0016cd85;
    }
    if (((uint)LVar3 >> 8 & 1) != 0) {
      LTAircraft::FlightPhase2String_abi_cxx11_(&local_90,(LTAircraft *)(ulong)pLVar2->phase,phase);
      std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      lVar7 = std::__cxx11::string::find_last_not_of((char *)&local_70,0x246096,0xffffffffffffffff);
      uVar8 = lVar7 + 1;
      if (local_68 < uVar8) goto LAB_0016cda6;
      local_70._M_p[uVar8] = '\0';
      local_68 = uVar8;
      std::__cxx11::string::find_first_not_of((char *)&local_70,0x246096,0);
      std::__cxx11::string::erase((ulong)&local_70,0);
      std::__cxx11::string::push_back((char)&local_70);
    }
    if (((uint)LVar3 >> 9 & 1) != 0) {
      uVar9 = lround((pLVar2->ppos)._head);
      uVar8 = -uVar9;
      if (0 < (long)uVar9) {
        uVar8 = uVar9;
      }
      uVar12 = 1;
      if (9 < uVar8) {
        uVar10 = uVar8;
        uVar4 = 4;
        do {
          uVar12 = uVar4;
          if (uVar10 < 100) {
            uVar12 = uVar12 - 2;
            goto LAB_0016c7f3;
          }
          if (uVar10 < 1000) {
            uVar12 = uVar12 - 1;
            goto LAB_0016c7f3;
          }
          if (uVar10 < 10000) goto LAB_0016c7f3;
          bVar5 = 99999 < uVar10;
          uVar10 = uVar10 / 10000;
          uVar4 = uVar12 + 4;
        } while (bVar5);
        uVar12 = uVar12 + 1;
      }
LAB_0016c7f3:
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct
                ((ulong)&local_90,(char)uVar12 - (char)((long)uVar9 >> 0x3f));
      std::__detail::__to_chars_10_impl<unsigned_long>
                (local_90._M_dataplus._M_p + -((long)uVar9 >> 0x3f),uVar12,uVar8);
      std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90._M_dataplus._M_p);
      this = local_48;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::push_back((char)&local_70);
    }
    if (((uint)LVar3 >> 10 & 1) != 0) {
      uVar9 = lround((pLVar2->ppos)._alt / 0.3048);
      uVar8 = -uVar9;
      if (0 < (long)uVar9) {
        uVar8 = uVar9;
      }
      uVar12 = 1;
      if (9 < uVar8) {
        uVar10 = uVar8;
        uVar4 = 4;
        do {
          uVar12 = uVar4;
          if (uVar10 < 100) {
            uVar12 = uVar12 - 2;
            goto LAB_0016c8ec;
          }
          if (uVar10 < 1000) {
            uVar12 = uVar12 - 1;
            goto LAB_0016c8ec;
          }
          if (uVar10 < 10000) goto LAB_0016c8ec;
          bVar5 = 99999 < uVar10;
          uVar10 = uVar10 / 10000;
          uVar4 = uVar12 + 4;
        } while (bVar5);
        uVar12 = uVar12 + 1;
      }
LAB_0016c8ec:
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct
                ((ulong)&local_90,(char)uVar12 - (char)((long)uVar9 >> 0x3f));
      std::__detail::__to_chars_10_impl<unsigned_long>
                (local_90._M_dataplus._M_p + -((long)uVar9 >> 0x3f),uVar12,uVar8);
      std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90._M_dataplus._M_p);
      this = local_48;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::push_back((char)&local_70);
    }
    if (((uint)LVar3 >> 0xb & 1) != 0) {
      pLVar2 = this->pAc;
      if ((pLVar2->super_Aircraft).bOnGrnd == true) {
        __s = positionTy::GrndE2String(GND_ON);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,__s,&local_49);
      }
      else {
        uVar9 = (ulong)(((pLVar2->ppos)._alt - pLVar2->terrainAlt_m) / 0.3048);
        uVar8 = -uVar9;
        if (0 < (long)uVar9) {
          uVar8 = uVar9;
        }
        uVar12 = 1;
        if (9 < uVar8) {
          uVar10 = uVar8;
          uVar4 = 4;
          do {
            uVar12 = uVar4;
            if (uVar10 < 100) {
              uVar12 = uVar12 - 2;
              goto LAB_0016ca1d;
            }
            if (uVar10 < 1000) {
              uVar12 = uVar12 - 1;
              goto LAB_0016ca1d;
            }
            if (uVar10 < 10000) goto LAB_0016ca1d;
            bVar5 = 99999 < uVar10;
            uVar10 = uVar10 / 10000;
            uVar4 = uVar12 + 4;
          } while (bVar5);
          uVar12 = uVar12 + 1;
        }
LAB_0016ca1d:
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_90,(char)uVar12 - (char)((long)uVar9 >> 0x3f));
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_90._M_dataplus._M_p + -((long)uVar9 >> 0x3f),uVar12,uVar8);
      }
      std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      this = local_48;
      lVar7 = std::__cxx11::string::find_last_not_of((char *)&local_70,0x246096,0xffffffffffffffff);
      uVar8 = lVar7 + 1;
      if (local_68 < uVar8) {
LAB_0016cda6:
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase",
                   uVar8);
      }
      local_70._M_p[uVar8] = '\0';
      local_68 = uVar8;
      std::__cxx11::string::find_first_not_of((char *)&local_70,0x246096,0);
      std::__cxx11::string::erase((ulong)&local_70,0);
      std::__cxx11::string::push_back((char)&local_70);
    }
    if (((uint)LVar3 >> 0xc & 1) != 0) {
      uVar9 = lround((this->pAc->speed).currSpeed_kt);
      uVar8 = -uVar9;
      if (0 < (long)uVar9) {
        uVar8 = uVar9;
      }
      uVar12 = 1;
      if (9 < uVar8) {
        uVar10 = uVar8;
        uVar4 = 4;
        do {
          uVar12 = uVar4;
          if (uVar10 < 100) {
            uVar12 = uVar12 - 2;
            goto LAB_0016cb81;
          }
          if (uVar10 < 1000) {
            uVar12 = uVar12 - 1;
            goto LAB_0016cb81;
          }
          if (uVar10 < 10000) goto LAB_0016cb81;
          bVar5 = 99999 < uVar10;
          uVar10 = uVar10 / 10000;
          uVar4 = uVar12 + 4;
        } while (bVar5);
        uVar12 = uVar12 + 1;
      }
LAB_0016cb81:
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct
                ((ulong)&local_90,(char)uVar12 - (char)((long)uVar9 >> 0x3f));
      std::__detail::__to_chars_10_impl<unsigned_long>
                (local_90._M_dataplus._M_p + -((long)uVar9 >> 0x3f),uVar12,uVar8);
      std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90._M_dataplus._M_p);
      this = local_48;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::push_back((char)&local_70);
    }
    if (((uint)LVar3 >> 0xd & 1) != 0) {
      uVar9 = lround(this->pAc->vsi);
      uVar8 = -uVar9;
      if (0 < (long)uVar9) {
        uVar8 = uVar9;
      }
      uVar12 = 1;
      if (9 < uVar8) {
        uVar10 = uVar8;
        uVar4 = 4;
        do {
          uVar12 = uVar4;
          if (uVar10 < 100) {
            uVar12 = uVar12 - 2;
            goto LAB_0016cc79;
          }
          if (uVar10 < 1000) {
            uVar12 = uVar12 - 1;
            goto LAB_0016cc79;
          }
          if (uVar10 < 10000) goto LAB_0016cc79;
          bVar5 = 99999 < uVar10;
          uVar10 = uVar10 / 10000;
          uVar4 = uVar12 + 4;
        } while (bVar5);
        uVar12 = uVar12 + 1;
      }
LAB_0016cc79:
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct
                ((ulong)&local_90,(char)uVar12 - (char)((long)uVar9 >> 0x3f));
      std::__detail::__to_chars_10_impl<unsigned_long>
                (local_90._M_dataplus._M_p + -((long)uVar9 >> 0x3f),uVar12,uVar8);
      std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90._M_dataplus._M_p);
      this = local_48;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::push_back((char)&local_70);
    }
    if (((uint)LVar3 >> 0xe & 1) != 0) {
      local_90._M_dataplus._M_p = (pointer)0x0;
      bVar5 = GetCurrChannel(this,(LTChannel **)&local_90);
      if (bVar5 && (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_90._M_dataplus._M_p !=
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0) {
        std::__cxx11::string::append((char *)&local_70);
        std::__cxx11::string::push_back((char)&local_70);
      }
    }
  }
  if (local_68 != 0) {
    std::__cxx11::string::pop_back();
  }
  (local_38->_M_dataplus)._M_p = (pointer)&local_38->field_2;
  if ((size_type *)local_70._M_p == &local_60) {
    (local_38->field_2)._M_allocated_capacity = local_60;
    *(undefined8 *)((long)&local_38->field_2 + 8) = uStack_58;
  }
  else {
    (local_38->_M_dataplus)._M_p = local_70._M_p;
    (local_38->field_2)._M_allocated_capacity = local_60;
  }
  local_38->_M_string_length = local_68;
  psVar11 = local_38;
  __mutex = local_40;
LAB_0016cd85:
  pthread_mutex_unlock(__mutex);
  return psVar11;
}

Assistant:

std::string LTFlightData::ComposeLabel() const
{
    try {
        // access guarded by a mutex
        std::lock_guard<std::recursive_mutex> lock (dataAccessMutex);

        // the configuration: which parts to include in the label?
        const DataRefs::LabelCfgTy cfg = dataRefs.GetLabelCfg();
        std::string label(labelStat);       // copy static parts
        
        // only possible if we have an aircraft
        if (pAc) {
            // If aircraft is parked and we shall not show labels for parked a/c, then return nothing
            if (!dataRefs.LabelShowForParked() &&
                pAc->GetFlightPhase() == FPH_PARKED)
                return "";
            
            // current position of a/c
            const positionTy& pos = pAc->GetPPos();
            // add more items as per configuration
            if (cfg.bPhase) { label +=  pAc->GetFlightPhaseString(); trim(label); label += ' '; }
            ADD_LABEL_NUM(cfg.bHeading,     pos.heading());
            ADD_LABEL_NUM(cfg.bAlt,         pos.alt_ft());
            if (cfg.bHeightAGL) {
                label += pAc->IsOnGrnd() ? positionTy::GrndE2String(GND_ON) :
                           std::to_string(long(pAc->GetPHeight_ft()));
                trim(label);
                label += ' ';
            }
            ADD_LABEL_NUM(cfg.bSpeed,       pAc->GetSpeed_kt());
            ADD_LABEL_NUM(cfg.bVSI,         pAc->GetVSI_ft());
            if (cfg.bChannel) {
                const LTChannel* pChn = nullptr;
                if (GetCurrChannel(pChn) && pChn) {
                    label += pChn->ChName();
                    label += ' ';
                }
            }
        }
        
        // remove the trailing space
        if (!label.empty())
            label.pop_back();
        
        return label;
        
    } catch(const std::system_error& e) {
        LOG_MSG(logERR, ERR_LOCK_ERROR, key().c_str(), e.what());
    }
    return "?";
}